

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  ImDrawList *draw_list;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  char *text;
  ImVec2 IVar5;
  float fVar6;
  float local_a4;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImU32 local_74;
  ImVec2 IStack_70;
  ImU32 text_col;
  undefined1 local_68 [8];
  ImRect bb;
  ImVec2 pos;
  ImVec2 total_size;
  ImVec2 label_size;
  char *text_end;
  char *text_begin;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    text = GImGui->TempBuffer;
    iVar3 = ImFormatStringV(GImGui->TempBuffer,0xc01,fmt,args);
    IVar5 = CalcTextSize(text,text + iVar3,false,-1.0);
    total_size.x = IVar5.x;
    if (total_size.x <= 0.0) {
      local_a4 = 0.0;
    }
    else {
      fVar6 = (pIVar1->Style).FramePadding.x;
      local_a4 = fVar6 + fVar6 + total_size.x;
    }
    total_size.y = IVar5.y;
    ImVec2::ImVec2(&pos,pIVar1->FontSize + local_a4,total_size.y);
    IVar5 = (pIVar4->DC).CursorPos;
    bb.Max.y = IVar5.y;
    bb.Max.x = IVar5.x;
    bb.Max.y = bb.Max.y + (pIVar4->DC).CurrLineTextBaseOffset;
    ItemSize(&pos,0.0);
    IStack_70 = operator+(&bb.Max,&pos);
    ImRect::ImRect((ImRect *)local_68,&bb.Max,&stack0xffffffffffffff90);
    bVar2 = ItemAdd((ImRect *)local_68,0,(ImRect *)0x0);
    if (bVar2) {
      local_74 = GetColorU32(0,1.0);
      draw_list = pIVar4->DrawList;
      fVar6 = pIVar1->FontSize * 0.5;
      ImVec2::ImVec2(&local_84,fVar6 + (pIVar1->Style).FramePadding.x,fVar6);
      local_7c = operator+((ImVec2 *)local_68,&local_84);
      RenderBullet(draw_list,local_7c,local_74);
      fVar6 = (pIVar1->Style).FramePadding.x;
      ImVec2::ImVec2(&local_94,fVar6 + fVar6 + pIVar1->FontSize,0.0);
      local_8c = operator+((ImVec2 *)local_68,&local_94);
      RenderText(local_8c,text,text + iVar3,false);
    }
  }
  return;
}

Assistant:

void ImGui::BulletTextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const char* text_begin = g.TempBuffer;
    const char* text_end = text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    const ImVec2 label_size = CalcTextSize(text_begin, text_end, false);
    const ImVec2 total_size = ImVec2(g.FontSize + (label_size.x > 0.0f ? (label_size.x + style.FramePadding.x * 2) : 0.0f), label_size.y);  // Empty text doesn't add padding
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(total_size, 0.0f);
    const ImRect bb(pos, pos + total_size);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderBullet(window->DrawList, bb.Min + ImVec2(style.FramePadding.x + g.FontSize*0.5f, g.FontSize*0.5f), text_col);
    RenderText(bb.Min + ImVec2(g.FontSize + style.FramePadding.x * 2, 0.0f), text_begin, text_end, false);
}